

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name_constraints.cc
# Opt level: O0

bool __thiscall bssl::NameConstraints::IsPermittedIP(NameConstraints *this,Input ip)

{
  bool bVar1;
  vector<std::pair<bssl::der::Input,_bssl::der::Input>,_std::allocator<std::pair<bssl::der::Input,_bssl::der::Input>_>_>
  *pvVar2;
  reference ppVar3;
  pair<bssl::der::Input,_bssl::der::Input> *permitted_ip;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<std::pair<bssl::der::Input,_bssl::der::Input>,_std::allocator<std::pair<bssl::der::Input,_bssl::der::Input>_>_>
  *__range1_1;
  pair<bssl::der::Input,_bssl::der::Input> *excluded_ip;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::pair<bssl::der::Input,_bssl::der::Input>,_std::allocator<std::pair<bssl::der::Input,_bssl::der::Input>_>_>
  *__range1;
  NameConstraints *this_local;
  Input ip_local;
  
  pvVar2 = &(this->excluded_subtrees_).ip_address_ranges;
  __end1 = ::std::
           vector<std::pair<bssl::der::Input,_bssl::der::Input>,_std::allocator<std::pair<bssl::der::Input,_bssl::der::Input>_>_>
           ::begin(pvVar2);
  excluded_ip = (pair<bssl::der::Input,_bssl::der::Input> *)
                ::std::
                vector<std::pair<bssl::der::Input,_bssl::der::Input>,_std::allocator<std::pair<bssl::der::Input,_bssl::der::Input>_>_>
                ::end(pvVar2);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_std::pair<bssl::der::Input,_bssl::der::Input>_*,_std::vector<std::pair<bssl::der::Input,_bssl::der::Input>,_std::allocator<std::pair<bssl::der::Input,_bssl::der::Input>_>_>_>
                                *)&excluded_ip);
    if (!bVar1) {
      if (((this->permitted_subtrees_).present_name_types & 0x80U) == 0) {
        ip_local.data_.size_._7_1_ = true;
      }
      else {
        pvVar2 = &(this->permitted_subtrees_).ip_address_ranges;
        __end1_1 = ::std::
                   vector<std::pair<bssl::der::Input,_bssl::der::Input>,_std::allocator<std::pair<bssl::der::Input,_bssl::der::Input>_>_>
                   ::begin(pvVar2);
        permitted_ip = (pair<bssl::der::Input,_bssl::der::Input> *)
                       ::std::
                       vector<std::pair<bssl::der::Input,_bssl::der::Input>,_std::allocator<std::pair<bssl::der::Input,_bssl::der::Input>_>_>
                       ::end(pvVar2);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end1_1,
                                  (__normal_iterator<const_std::pair<bssl::der::Input,_bssl::der::Input>_*,_std::vector<std::pair<bssl::der::Input,_bssl::der::Input>,_std::allocator<std::pair<bssl::der::Input,_bssl::der::Input>_>_>_>
                                   *)&permitted_ip), bVar1) {
          ppVar3 = __gnu_cxx::
                   __normal_iterator<const_std::pair<bssl::der::Input,_bssl::der::Input>_*,_std::vector<std::pair<bssl::der::Input,_bssl::der::Input>,_std::allocator<std::pair<bssl::der::Input,_bssl::der::Input>_>_>_>
                   ::operator*(&__end1_1);
          bVar1 = IPAddressMatchesWithNetmask
                            (ip,(Input)(ppVar3->first).data_,(Input)(ppVar3->second).data_);
          if (bVar1) {
            return true;
          }
          __gnu_cxx::
          __normal_iterator<const_std::pair<bssl::der::Input,_bssl::der::Input>_*,_std::vector<std::pair<bssl::der::Input,_bssl::der::Input>,_std::allocator<std::pair<bssl::der::Input,_bssl::der::Input>_>_>_>
          ::operator++(&__end1_1);
        }
        ip_local.data_.size_._7_1_ = false;
      }
      return ip_local.data_.size_._7_1_;
    }
    ppVar3 = __gnu_cxx::
             __normal_iterator<const_std::pair<bssl::der::Input,_bssl::der::Input>_*,_std::vector<std::pair<bssl::der::Input,_bssl::der::Input>,_std::allocator<std::pair<bssl::der::Input,_bssl::der::Input>_>_>_>
             ::operator*(&__end1);
    bVar1 = IPAddressMatchesWithNetmask
                      (ip,(Input)(ppVar3->first).data_,(Input)(ppVar3->second).data_);
    if (bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_std::pair<bssl::der::Input,_bssl::der::Input>_*,_std::vector<std::pair<bssl::der::Input,_bssl::der::Input>,_std::allocator<std::pair<bssl::der::Input,_bssl::der::Input>_>_>_>
    ::operator++(&__end1);
  }
  return false;
}

Assistant:

bool NameConstraints::IsPermittedIP(der::Input ip) const {
  for (const auto &excluded_ip : excluded_subtrees_.ip_address_ranges) {
    if (IPAddressMatchesWithNetmask(ip, excluded_ip.first,
                                    excluded_ip.second)) {
      return false;
    }
  }

  // If permitted subtrees are not constrained, any name that is not excluded is
  // allowed.
  if (!(permitted_subtrees_.present_name_types & GENERAL_NAME_IP_ADDRESS)) {
    return true;
  }

  for (const auto &permitted_ip : permitted_subtrees_.ip_address_ranges) {
    if (IPAddressMatchesWithNetmask(ip, permitted_ip.first,
                                    permitted_ip.second)) {
      return true;
    }
  }

  return false;
}